

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

int Bac_ManAddBarbuf(Gia_Man_t *pNew,int iRes,Bac_Man_t *p,int iLNtk,int iLObj,int iRNtk,int iRObj,
                    Vec_Int_t *vMap)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int Entry;
  Gia_Obj_t *pObj;
  char *__assertion;
  ulong uVar5;
  
  if ((uint)iRes < 2) {
    return iRes;
  }
  if (iRes < 1) {
    __assertion = "iRes > 0";
    uVar2 = 0x5c;
  }
  else {
    if ((vMap != (Vec_Int_t *)0x0) && (iVar1 = Abc_Lit2Var(iRes), iVar1 < vMap->nSize)) {
      iVar1 = Abc_Lit2Var(iRes);
      uVar2 = Vec_IntEntry(vMap,iVar1);
      if (-1 < (int)uVar2) {
        iVar1 = Abc_Lit2Var(uVar2);
        iVar1 = Vec_IntEntry(&p->vBuf2LeafNtk,iVar1);
        if (iVar1 == iLNtk) {
          iVar1 = Abc_Lit2Var(uVar2);
          iVar1 = Vec_IntEntry(&p->vBuf2RootNtk,iVar1);
          if (iVar1 == iRNtk) {
            p_00 = pNew->vBarBufs;
            iVar1 = Abc_Lit2Var(uVar2);
            uVar3 = Vec_IntEntry(p_00,iVar1);
            if (-1 < (int)uVar3) {
              return uVar3 ^ (uVar2 ^ iRes) & 1;
            }
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
        }
      }
    }
    if ((((0 < iLNtk) && (0 < iRNtk)) && (iLNtk <= p->nNtks)) && ((uint)iRNtk <= (uint)p->nNtks)) {
      Vec_IntPush(&p->vBuf2LeafNtk,iLNtk);
      Vec_IntPush(&p->vBuf2LeafObj,iLObj);
      Vec_IntPush(&p->vBuf2RootNtk,iRNtk);
      Vec_IntPush(&p->vBuf2RootObj,iRObj);
      pObj = Gia_ManAppendObj(pNew);
      iVar1 = Abc_Lit2Var(iRes);
      if (pNew->nObjs <= iVar1) {
        __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x30b,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
      }
      iVar1 = Gia_ObjId(pNew,pObj);
      iVar4 = Abc_Lit2Var(iRes);
      uVar5 = (ulong)(iVar1 - iVar4 & 0x1fffffff);
      uVar2 = iRes & 1;
      *(ulong *)pObj =
           (ulong)(uVar2 << 0x1d) |
           (ulong)uVar2 << 0x3d | *(ulong *)pObj & 0xc0000000c0000000 | uVar5 << 0x20 | uVar5;
      pNew->nBufs = pNew->nBufs + 1;
      iVar1 = Gia_ObjId(pNew,pObj);
      iVar1 = iVar1 * 2;
      if (vMap == (Vec_Int_t *)0x0) {
        return iVar1;
      }
      iVar4 = Abc_Lit2Var(iRes);
      Entry = Abc_Var2Lit(pNew->vBarBufs->nSize,uVar2);
      Vec_IntFillExtra(vMap,iVar4 + 1,-1);
      Vec_IntWriteEntry(vMap,iVar4,Entry);
      Vec_IntPush(pNew->vBarBufs,iVar1);
      return iVar1;
    }
    __assertion = "Bac_ManNtkIsOk(p, iLNtk) && Bac_ManNtkIsOk(p, iRNtk)";
    uVar2 = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                ,uVar2,
                "int Bac_ManAddBarbuf(Gia_Man_t *, int, Bac_Man_t *, int, int, int, int, Vec_Int_t *)"
               );
}

Assistant:

int Bac_ManAddBarbuf( Gia_Man_t * pNew, int iRes, Bac_Man_t * p, int iLNtk, int iLObj, int iRNtk, int iRObj, Vec_Int_t * vMap )
{
    int iBufLit, iIdLit;
    if ( iRes == 0 || iRes == 1 )
        return iRes;
    assert( iRes > 0 );
    if ( vMap && Abc_Lit2Var(iRes) < Vec_IntSize(vMap) && (iIdLit = Vec_IntEntry(vMap, Abc_Lit2Var(iRes))) >= 0 && 
        Vec_IntEntry(&p->vBuf2LeafNtk, Abc_Lit2Var(iIdLit)) == iLNtk && Vec_IntEntry(&p->vBuf2RootNtk, Abc_Lit2Var(iIdLit)) == iRNtk )
        return Abc_LitNotCond( Vec_IntEntry(pNew->vBarBufs, Abc_Lit2Var(iIdLit)), Abc_LitIsCompl(iRes) ^ Abc_LitIsCompl(iIdLit) );
    assert( Bac_ManNtkIsOk(p, iLNtk) && Bac_ManNtkIsOk(p, iRNtk) );
    Vec_IntPush( &p->vBuf2LeafNtk, iLNtk );
    Vec_IntPush( &p->vBuf2LeafObj, iLObj );
    Vec_IntPush( &p->vBuf2RootNtk, iRNtk );
    Vec_IntPush( &p->vBuf2RootObj, iRObj );
    iBufLit = Gia_ManAppendBuf( pNew, iRes );
    if ( vMap )
    {
        Vec_IntSetEntryFull( vMap, Abc_Lit2Var(iRes), Abc_Var2Lit(Vec_IntSize(pNew->vBarBufs), Abc_LitIsCompl(iRes)) );
        Vec_IntPush( pNew->vBarBufs, iBufLit );
    }
    return iBufLit;
}